

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O2

int CgroupController::init(EVP_PKEY_CTX *ctx)

{
  _Alloc_hider _Var1;
  int extraout_EAX;
  Config *this;
  path *__lhs;
  ContextManager *pCVar2;
  path pStack_b8;
  error_code error;
  path local_68;
  path path;
  
  this = Config::get();
  __lhs = Config::get_cgroup_root_abi_cxx11_(this);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx,
             auto_format);
  std::filesystem::__cxx11::operator/(&pStack_b8,__lhs,&local_68);
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            ((path *)&error,(char (*) [8])"libsbox",auto_format);
  std::filesystem::__cxx11::operator/(&path,&pStack_b8,(path *)&error);
  std::filesystem::__cxx11::path::~path((path *)&error);
  std::filesystem::__cxx11::path::~path(&pStack_b8);
  std::filesystem::__cxx11::path::~path(&local_68);
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::remove(&path,&error);
  if (error._M_value != 0) {
    pCVar2 = ContextManager::get();
    _Var1 = path._M_pathname._M_dataplus;
    (**(code **)(*(long *)error._M_cat + 0x20))(&local_68,error._M_cat,error._M_value);
    format_abi_cxx11_(&pStack_b8._M_pathname,"Cannot remove dir \'%s\': %s",_Var1._M_p,
                      local_68._M_pathname._M_dataplus._M_p);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&pStack_b8);
    std::__cxx11::string::~string((string *)&pStack_b8);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::filesystem::create_directories(&path,&error);
  if (error._M_value != 0) {
    pCVar2 = ContextManager::get();
    (**(code **)(*(long *)error._M_cat + 0x20))(&local_68,error._M_cat,error._M_value);
    format_abi_cxx11_(&pStack_b8._M_pathname,"Cannot create dir \'%s\': %s",
                      path._M_pathname._M_dataplus._M_p,local_68._M_pathname._M_dataplus._M_p);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&pStack_b8);
    std::__cxx11::string::~string((string *)&pStack_b8);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::filesystem::__cxx11::path::~path(&path);
  return extraout_EAX;
}

Assistant:

void CgroupController::init(const std::string &name) {
    fs::path path = Config::get().get_cgroup_root() / name / "libsbox";
    std::error_code error;
    fs::remove(path, error);
    if (error) {
        die(format("Cannot remove dir '%s': %s", path.c_str(), error.message().c_str()));
    }
    fs::create_directories(path, error);
    if (error) {
        die(format("Cannot create dir '%s': %s", path.c_str(), error.message().c_str()));
    }
}